

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

void __thiscall QListViewPrivate::prepareItemsLayout(QListViewPrivate *this)

{
  Representation *pRVar1;
  QPersistentModelIndex *this_00;
  long lVar2;
  QWidget *this_01;
  QAbstractItemModel *pQVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  QSize QVar8;
  QStyle *pQVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  QModelIndex local_90;
  QStyleOption option;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QWidget **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  (this->cachedItemSize).wd = -1;
  (this->cachedItemSize).ht = -1;
  (*this->commonListView->_vptr_QCommonListViewBase[5])();
  QVar8 = QAbstractScrollArea::maximumViewportSize((QAbstractScrollArea *)this_01);
  (this->layoutBounds).x1 = 0;
  (this->layoutBounds).y1 = 0;
  (this->layoutBounds).x2.m_i = QVar8.wd.m_i.m_i + -1;
  (this->layoutBounds).y2.m_i = QVar8.ht.m_i.m_i + -1;
  pQVar9 = QWidget::style(this_01);
  iVar4 = (**(code **)(*(long *)pQVar9 + 0xf0))(pQVar9,0x11,0,this_01,0);
  iVar5 = 0;
  if (iVar4 != 0) {
    option.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    option.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    option._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    option.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    option.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    option.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    option._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    option._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOption::QStyleOption(&option,1,0);
    QStyleOption::initFrom(&option,this_01);
    pQVar9 = QWidget::style(this_01);
    iVar5 = (**(code **)(*(long *)pQVar9 + 0xe0))(pQVar9,5,&option,this_01);
    iVar5 = iVar5 * 2;
    QStyleOption::~QStyleOption(&option);
  }
  iVar4 = 0;
  if (((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.vbarpolicy ==
       ScrollBarAsNeeded) &&
     ((this->flow == LeftToRight ||
      (iVar4 = 0,
      (((((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.vbar)->
        super_QAbstractSlider).super_QWidget.data)->widget_attributes & 0x8000) != 0)))) {
    pQVar9 = QWidget::style(this_01);
    iVar4 = 0;
    iVar6 = (**(code **)(*(long *)pQVar9 + 0xe0))
                      (pQVar9,0x56,0,
                       (this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.vbar)
    ;
    if (iVar6 == 0) {
      pQVar9 = QWidget::style(this_01);
      iVar4 = (**(code **)(*(long *)pQVar9 + 0xe0))
                        (pQVar9,9,0,
                         (this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                         vbar);
      iVar4 = iVar4 + iVar5;
    }
  }
  uVar10 = 0;
  iVar6 = 0;
  if ((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.hbarpolicy ==
      ScrollBarAsNeeded) {
    pQVar9 = QWidget::style(this_01);
    iVar6 = (**(code **)(*(long *)pQVar9 + 0xe0))
                      (pQVar9,9,0,
                       (this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.hbar)
    ;
    iVar6 = iVar6 + iVar5;
  }
  pRVar1 = &(this->layoutBounds).x2;
  pRVar1->m_i = pRVar1->m_i - iVar4;
  pRVar1 = &(this->layoutBounds).y2;
  pRVar1->m_i = pRVar1->m_i - iVar6;
  pQVar3 = (this->super_QAbstractItemViewPrivate).model;
  this_00 = &(this->super_QAbstractItemViewPrivate).root;
  QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&option,this_00);
  iVar5 = (**(code **)(*(long *)pQVar3 + 0x80))(pQVar3,&option);
  if (0 < iVar5) {
    pQVar3 = (this->super_QAbstractItemViewPrivate).model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_90,this_00);
    uVar7 = (**(code **)(*(long *)pQVar3 + 0x78))(pQVar3,&local_90);
    uVar10 = (ulong)uVar7;
  }
  (*this->commonListView->_vptr_QCommonListViewBase[6])(this->commonListView,uVar10);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListViewPrivate::prepareItemsLayout()
{
    Q_Q(QListView);
    clear();

    //take the size as if there were scrollbar in order to prevent scrollbar to blink
    layoutBounds = QRect(QPoint(), q->maximumViewportSize());

    int frameAroundContents = 0;
    if (q->style()->styleHint(QStyle::SH_ScrollView_FrameOnlyAroundContents, nullptr, q)) {
        QStyleOption option;
        option.initFrom(q);
        frameAroundContents = q->style()->pixelMetric(QStyle::PM_DefaultFrameWidth, &option, q) * 2;
    }

    // maximumViewportSize() already takes scrollbar into account if policy is
    // Qt::ScrollBarAlwaysOn but scrollbar extent must be deduced if policy
    // is Qt::ScrollBarAsNeeded
    int verticalMargin = (vbarpolicy == Qt::ScrollBarAsNeeded) && (flow == QListView::LeftToRight || vbar->isVisible())
                        && !q->style()->pixelMetric(QStyle::PM_ScrollView_ScrollBarOverlap, nullptr, vbar)
        ? q->style()->pixelMetric(QStyle::PM_ScrollBarExtent, nullptr, vbar) + frameAroundContents
        : 0;
    int horizontalMargin =  hbarpolicy==Qt::ScrollBarAsNeeded
        ? q->style()->pixelMetric(QStyle::PM_ScrollBarExtent, nullptr, hbar) + frameAroundContents
        : 0;

    layoutBounds.adjust(0, 0, -verticalMargin, -horizontalMargin);

    int rowCount = model->columnCount(root) <= 0 ? 0 : model->rowCount(root);
    commonListView->setRowCount(rowCount);
}